

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::SourceCodeInfo::Swap(SourceCodeInfo *this,SourceCodeInfo *other)

{
  SourceCodeInfo *other_local;
  SourceCodeInfo *this_local;
  
  if (other != this) {
    RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::Swap
              (&this->location_,&other->location_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  }
  return;
}

Assistant:

void SourceCodeInfo::Swap(SourceCodeInfo* other) {
  if (other != this) {
    location_.Swap(&other->location_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}